

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipleofnumbers.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int __x;
  int iVar1;
  istream *piVar2;
  ostream *poVar3;
  int iVar4;
  __type __x_00;
  double dVar5;
  int local_41c;
  vector<int,_std::allocator<int>_> nums;
  string line;
  string token;
  ifstream stream;
  istringstream ss;
  
  std::ifstream::ifstream(&stream,argv[1],_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  token.field_2._M_local_buf[0] = '\0';
  nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&stream,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&line,_S_in);
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ss,(string *)&token,',');
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      local_41c = std::__cxx11::stoi(&token,(size_t *)0x0,10);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&nums,&local_41c);
    }
    iVar4 = *nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    __x = nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[1];
    __x_00 = std::log2<int>(__x);
    dVar5 = floor(__x_00);
    if ((__x_00 != dVar5) || (NAN(__x_00) || NAN(dVar5))) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Bad input");
    }
    else {
      iVar4 = iVar4 + 1;
      iVar1 = iVar4;
      if (iVar4 < __x) {
        iVar1 = __x;
      }
      poVar3 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          ((uint)(__x < iVar4) +
                           ((iVar1 - __x) - (uint)(__x < iVar4)) / (__x + (uint)(__x == 0)) + 1) *
                          __x);
    }
    std::endl<char,std::char_traits<char>>(poVar3);
    if (nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        != nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start) {
      nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&nums.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&token);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&stream);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);
//    ifstream stream("/home/arkezar/nums");
    string line;
    string token;
    vector<int> nums;
    int x, n, multN;
    while (getline(stream, line)) {
        istringstream ss(line);
        while(getline(ss,token,',')){
            nums.push_back(stoi(token));
        }

        n = nums[1];
        x = nums[0];
        if(isInt(log2(n))) {
            multN = n;
            while (multN <= x) {
                multN += n;
            }

            cout << multN << endl;
        } else {
            cout << "Bad input" << endl;
        }
        nums.clear();
    }
    return 0;
}